

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O1

void __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::~deadline_timer_service
          (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this)

{
  ~deadline_timer_service(this);
  operator_delete(this);
  return;
}

Assistant:

~deadline_timer_service()
  {
    scheduler_.remove_timer_queue(timer_queue_);
  }